

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImDrawDataBuilder::FlattenIntoSingleLayer(ImDrawDataBuilder *this)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  ImDrawList **ppIVar4;
  uint uVar5;
  ImDrawList **ppIVar6;
  int iVar7;
  int iVar8;
  
  uVar2 = this->Layers[0].Size;
  iVar8 = this->Layers[0].Capacity;
  uVar3 = this->Layers[1].Size;
  iVar7 = uVar3 + uVar2;
  uVar5 = uVar3;
  if (iVar8 < iVar7) {
    if (iVar8 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar8 / 2 + iVar8;
    }
    if (iVar8 <= iVar7) {
      iVar8 = iVar7;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar6 = (ImDrawList **)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData);
    ppIVar4 = this->Layers[0].Data;
    if (ppIVar4 != (ImDrawList **)0x0) {
      memcpy(ppIVar6,ppIVar4,(long)this->Layers[0].Size << 3);
      ppIVar4 = this->Layers[0].Data;
      if ((ppIVar4 != (ImDrawList **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
    }
    this->Layers[0].Data = ppIVar6;
    this->Layers[0].Capacity = iVar8;
    uVar5 = this->Layers[1].Size;
  }
  this->Layers[0].Size = iVar7;
  if (uVar5 != 0) {
    if ((((int)uVar2 < 0) || ((int)uVar3 < 1)) || ((int)uVar5 < 1)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                    ,0x5c2,"T &ImVector<ImDrawList *>::operator[](int) [T = ImDrawList *]");
    }
    memcpy(this->Layers[0].Data + uVar2,this->Layers[1].Data,(ulong)uVar5 << 3);
    if (this->Layers[1].Capacity < 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar6 = (ImDrawList **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      ppIVar4 = this->Layers[1].Data;
      if (ppIVar4 != (ImDrawList **)0x0) {
        memcpy(ppIVar6,ppIVar4,(long)this->Layers[1].Size << 3);
        ppIVar4 = this->Layers[1].Data;
        if ((ppIVar4 != (ImDrawList **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      this->Layers[1].Data = ppIVar6;
      this->Layers[1].Capacity = 0;
    }
    this->Layers[1].Size = 0;
  }
  return;
}

Assistant:

void ImDrawDataBuilder::FlattenIntoSingleLayer()
{
    int n = Layers[0].Size;
    int size = n;
    for (int i = 1; i < IM_ARRAYSIZE(Layers); i++)
        size += Layers[i].Size;
    Layers[0].resize(size);
    for (int layer_n = 1; layer_n < IM_ARRAYSIZE(Layers); layer_n++)
    {
        ImVector<ImDrawList*>& layer = Layers[layer_n];
        if (layer.empty())
            continue;
        memcpy(&Layers[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
        n += layer.Size;
        layer.resize(0);
    }
}